

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_add_hl_bc_Test::CpuTest_add_hl_bc_Test(CpuTest_add_hl_bc_Test *this)

{
  CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_00192968;
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_bc) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 1;
    regs.l = 2;
    regs.b = 1;
    regs.c = 2;
    execute_instruction(0x09);

    ICpu::Registers expected_regs{};
    expected_regs.b = 1;
    expected_regs.c = 2;
    expected_regs.h = 2;
    expected_regs.l = 4;
    expected_regs.f = ICpu::Z_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}